

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

int ddSymmGroupMove(DdManager *table,int x,int y,Move **moves)

{
  uint uVar1;
  DdNode *pDVar2;
  DdHalfWord local_60;
  DdHalfWord local_5c;
  int swapy;
  int swapx;
  int newxtop;
  int ysize;
  int ybot;
  int ytop;
  int xsize;
  int xbot;
  int xtop;
  int j;
  int i;
  int size;
  Move *move;
  Move **moves_local;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  j = -1;
  local_5c = 0xffffffff;
  local_60 = 0xffffffff;
  uVar1 = table->subtables[x].next;
  for (newxtop = y; (uint)newxtop < table->subtables[newxtop].next;
      newxtop = table->subtables[newxtop].next) {
  }
  xtop = 1;
  moves_local._0_4_ = y;
  moves_local._4_4_ = x;
  do {
    if ((newxtop - y) + 1 < xtop) {
      moves_local._0_4_ = uVar1;
      for (xtop = 0; xtop < newxtop - y; xtop = xtop + 1) {
        table->subtables[(int)(DdHalfWord)moves_local].next = (DdHalfWord)moves_local + 1;
        moves_local._0_4_ = (DdHalfWord)moves_local + 1;
      }
      table->subtables[(int)(DdHalfWord)moves_local].next = uVar1;
      moves_local._4_4_ = (DdHalfWord)moves_local + 1;
      for (xtop = 0; xtop < (int)(x - uVar1); xtop = xtop + 1) {
        table->subtables[(int)moves_local._4_4_].next = moves_local._4_4_ + 1;
        moves_local._4_4_ = moves_local._4_4_ + 1;
      }
      table->subtables[(int)moves_local._4_4_].next = (DdHalfWord)moves_local + 1;
      pDVar2 = cuddDynamicAllocNode(table);
      if (pDVar2 == (DdNode *)0x0) {
        table_local._4_4_ = 0;
      }
      else {
        pDVar2->index = local_5c;
        pDVar2->ref = local_60;
        *(int *)((long)&pDVar2->next + 4) = j;
        (pDVar2->type).kids.T = (DdNode *)*moves;
        *moves = (Move *)pDVar2;
        table_local._4_4_ = j;
      }
      return table_local._4_4_;
    }
    for (xbot = 1; xbot <= (int)((x - uVar1) + 1); xbot = xbot + 1) {
      j = cuddSwapInPlace(table,moves_local._4_4_,(DdHalfWord)moves_local);
      if (j == 0) {
        return 0;
      }
      local_5c = moves_local._4_4_;
      local_60 = (DdHalfWord)moves_local;
      moves_local._0_4_ = moves_local._4_4_;
      moves_local._4_4_ = moves_local._4_4_ - 1;
    }
    moves_local._0_4_ = y + xtop;
    moves_local._4_4_ = (DdHalfWord)moves_local - 1;
    xtop = xtop + 1;
  } while( true );
}

Assistant:

static int
ddSymmGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size = -1;
    int  i,j;
    int  xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx = -1,swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

    /* Sift the variables of the second group up through the first group. */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0) return(0);
            swapx = x; swapy = y;
            y = x;
            x = y - 1;
        }
        y = ytop + i;
        x = y - 1;
    }

    /* fix symmetries */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize-1 ; i++) {
        table->subtables[y].next = y + 1;
        y = y + 1;
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                     /* its symmetry to top of its group */
    x = y + 1;
    newxtop = x;
    for (i = 0; i < xsize - 1 ; i++) {
        table->subtables[x].next = x + 1;
        x = x + 1;
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                        /* its symmetry to top of its group */
    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) return(0);
    move->x = swapx;
    move->y = swapy;
    move->size = size;
    move->next = *moves;
    *moves = move;

    return(size);

}